

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O2

void __thiscall
agg::curve3_div::bezier
          (curve3_div *this,double x1,double y1,double x2,double y2,double x3,double y3)

{
  point_base<double> local_28;
  
  local_28.x = x1;
  local_28.y = y1;
  pod_bvector<agg::point_base<double>,_6U>::add
            ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20),&local_28);
  recursive_bezier(this,x1,y1,x2,y2,x3,y3,0);
  local_28.x = x3;
  local_28.y = y3;
  pod_bvector<agg::point_base<double>,_6U>::add
            ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x20),&local_28);
  return;
}

Assistant:

void curve3_div::bezier(double x1, double y1, 
                            double x2, double y2, 
                            double x3, double y3)
    {
        m_points.add(point_d(x1, y1));
        recursive_bezier(x1, y1, x2, y2, x3, y3, 0);
        m_points.add(point_d(x3, y3));
    }